

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.h
# Opt level: O2

void __thiscall
hedg::Rest_Client::
send<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Lay>>
          (Rest_Client *this,
          _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Lay>
          *f,place_order<hedg::Lay> *p)

{
  string_view target;
  undefined1 auStack_108 [8];
  request<http::string_body> req;
  place_order<hedg::Lay> local_80;
  
  target.ptr_ = (p->end_point)._M_dataplus._M_p;
  target.len_ = (p->end_point)._M_string_length;
  boost::beast::http::
  message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
  ::message<int,void>((message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
                       *)&req,post,target,0xb);
  params::place_order<hedg::Lay>::place_order(&local_80,p);
  (*f)(&req,_auStack_108);
  params::place_order<hedg::Lay>::~place_order(&local_80);
  boost::beast::http::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (&(this->super_Client<hedg::Rest_Client>).sock_,&req);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&req);
  return;
}

Assistant:

void send(void(*f)(Buff&, T), T p) {
		http::request<http::string_body> req{ http::verb::post, p.end_point, 11 };
		f(req, p);
		http::write(sock_, req);
	}